

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::ImmutablePatternModifier::applyToMicros
          (ImmutablePatternModifier *this,MicroProps *micros,DecimalQuantity *quantity)

{
  AdoptingModifierStore *pAVar1;
  int8_t iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  fd_set *in_RCX;
  uint uVar5;
  fd_set *in_R8;
  timeval *in_R9;
  UnicodeString ruleString;
  DecimalQuantity copy;
  UnicodeString UStack_b8;
  
  if (this->rules == (PluralRules *)0x0) {
    pAVar1 = (this->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr;
    iVar2 = DecimalQuantity::signum(quantity);
    micros->modMiddle = pAVar1->mods[(long)iVar2 + 0x10];
  }
  else {
    DecimalQuantity::DecimalQuantity((DecimalQuantity *)&stack0xffffffffffffff88,quantity);
    DecimalQuantity::roundToInfinity((DecimalQuantity *)&stack0xffffffffffffff88);
    if (this->rules == (PluralRules *)0x0) {
      uVar5 = 5;
    }
    else {
      PluralRules::select((PluralRules *)&UStack_b8,(int)this->rules,
                          (fd_set *)&stack0xffffffffffffff88,in_RCX,in_R8,in_R9);
      uVar3 = StandardPlural::indexOrNegativeFromString(&UStack_b8);
      uVar5 = 5;
      if (-1 < (int)uVar3) {
        uVar5 = uVar3;
      }
      UnicodeString::~UnicodeString(&UStack_b8);
    }
    pAVar1 = (this->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr;
    iVar2 = DecimalQuantity::signum(quantity);
    iVar4 = (*(pAVar1->super_ModifierStore)._vptr_ModifierStore[2])
                      (pAVar1,(ulong)(uint)(int)iVar2,(ulong)uVar5);
    micros->modMiddle = (Modifier *)CONCAT44(extraout_var,iVar4);
    DecimalQuantity::~DecimalQuantity((DecimalQuantity *)&stack0xffffffffffffff88);
  }
  return;
}

Assistant:

void ImmutablePatternModifier::applyToMicros(MicroProps& micros, DecimalQuantity& quantity) const {
    if (rules == nullptr) {
        micros.modMiddle = pm->getModifierWithoutPlural(quantity.signum());
    } else {
        // TODO: Fix this. Avoid the copy.
        DecimalQuantity copy(quantity);
        copy.roundToInfinity();
        StandardPlural::Form plural = utils::getStandardPlural(rules, copy);
        micros.modMiddle = pm->getModifier(quantity.signum(), plural);
    }
}